

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomReporter.cpp
# Opt level: O3

shared_ptr<ApprovalTests::GenericDiffReporter> __thiscall
ApprovalTests::CustomReporter::createForegroundReporter
          (CustomReporter *this,string *path,Type type,bool allowNonZeroExitCodes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<ApprovalTests::GenericDiffReporter> sVar3;
  string local_60;
  string local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  local_60._M_dataplus._M_p = (path->_M_dataplus)._M_p;
  paVar1 = &path->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == paVar1) {
    local_60.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_60.field_2._8_8_ = *(undefined8 *)((long)&path->field_2 + 8);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_60._M_string_length = path->_M_string_length;
  (path->_M_dataplus)._M_p = (pointer)paVar1;
  path->_M_string_length = 0;
  (path->field_2)._M_local_buf[0] = '\0';
  DiffInfo::getDefaultArguments_abi_cxx11_();
  sVar3 = createForegroundReporter(this,&local_60,&local_40,type,allowNonZeroExitCodes);
  _Var2 = sVar3.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
    _Var2._M_pi = extraout_RDX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<ApprovalTests::GenericDiffReporter>)
         sVar3.super___shared_ptr<ApprovalTests::GenericDiffReporter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GenericDiffReporter> CustomReporter::createForegroundReporter(
        std::string path, Type type, bool allowNonZeroExitCodes)
    {
        return createForegroundReporter(std::move(path),
                                        DiffInfo::getDefaultArguments(),
                                        type,
                                        allowNonZeroExitCodes);
    }